

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O1

Vector6d * gmath::combine(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int i;
  long lVar4;
  double (*padVar5) [3];
  int k;
  long lVar6;
  Vector6d *pose;
  double (*padVar7) [3];
  int i_6;
  double (*padVar8) [3];
  int j;
  long lVar9;
  double ret;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  SVector<double,_3> ret_2;
  SVector<double,_3> ret_5;
  SVector<double,_3> ret_1;
  Vector3d T;
  Matrix33d R;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  Vector3d local_f8;
  Matrix33d local_d8;
  double local_88 [4];
  Matrix33d local_68;
  
  local_138._8_8_ = local_138._0_8_;
  local_148 = *(undefined1 (*) [16])(pose0->v + 3);
  local_138._0_8_ = pose0->v[5];
  dVar10 = 0.0;
  lVar4 = 0;
  do {
    dVar10 = dVar10 + *(double *)(local_148 + lVar4 * 8) * *(double *)(local_148 + lVar4 * 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_d8.v[0][0] = 0.0;
    local_d8.v[0][1] = 0.0;
    local_d8.v[0][2] = 0.0;
    lVar4 = 0;
    do {
      local_d8.v[0][lVar4] = *(double *)(local_148 + lVar4 * 8) / dVar10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    createR(&local_68,(Vector3d *)&local_d8,dVar10);
  }
  else {
    local_68.v[2][0] = 0.0;
    local_68.v[2][1] = 0.0;
    local_68.v[1][1] = 0.0;
    local_68.v[1][2] = 0.0;
    local_68.v[0][2] = 0.0;
    local_68.v[1][0] = 0.0;
    local_68.v[0][0] = 0.0;
    local_68.v[0][1] = 0.0;
    local_68.v[2][2] = 0.0;
    lVar4 = 0;
    auVar11 = _DAT_00121070;
    do {
      if (SUB164(auVar11 ^ _DAT_00121080,4) == -0x80000000 &&
          SUB164(auVar11 ^ _DAT_00121080,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_68.v[0] + lVar4) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_68.v[1] + lVar4 + 8) = 0x3ff0000000000000;
      }
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x80);
  }
  local_d8.v[0][0] = pose1->v[0];
  local_d8.v[0][1] = pose1->v[1];
  local_d8.v[0][2] = pose1->v[2];
  local_148 = ZEXT816(0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_138._8_8_;
  local_138 = auVar3 << 0x40;
  padVar5 = (double (*) [3])&local_68;
  lVar4 = 0;
  do {
    dVar10 = *(double *)(local_148 + lVar4 * 8);
    lVar6 = 0;
    do {
      dVar10 = dVar10 + (*(double (*) [3])*padVar5)[lVar6] * local_d8.v[0][lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    *(double *)(local_148 + lVar4 * 8) = dVar10;
    lVar4 = lVar4 + 1;
    padVar5 = padVar5 + 1;
  } while (lVar4 != 3);
  local_f8.v[0] = pose0->v[0];
  local_f8.v[1] = pose0->v[1];
  local_f8.v[2] = pose0->v[2];
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar4 = 0;
  do {
    local_88[lVar4] = *(double *)(local_148 + lVar4 * 8) + local_f8.v[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_148 = *(undefined1 (*) [16])(pose1->v + 3);
  local_138._0_8_ = pose1->v[5];
  dVar10 = 0.0;
  lVar4 = 0;
  do {
    dVar10 = dVar10 + *(double *)(local_148 + lVar4 * 8) * *(double *)(local_148 + lVar4 * 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_f8.v[0] = 0.0;
    local_f8.v[1] = 0.0;
    local_f8.v[2] = 0.0;
    lVar4 = 0;
    do {
      local_f8.v[lVar4] = *(double *)(local_148 + lVar4 * 8) / dVar10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    createR(&local_d8,&local_f8,dVar10);
  }
  else {
    local_d8.v[2][0] = 0.0;
    local_d8.v[2][1] = 0.0;
    local_d8.v[1][1] = 0.0;
    local_d8.v[1][2] = 0.0;
    local_d8.v[0][2] = 0.0;
    local_d8.v[1][0] = 0.0;
    local_d8.v[0][0] = 0.0;
    local_d8.v[0][1] = 0.0;
    local_d8.v[2][2] = 0.0;
    lVar4 = 0;
    auVar12 = _DAT_00121070;
    do {
      if (SUB164(auVar12 ^ _DAT_00121080,4) == -0x80000000 &&
          SUB164(auVar12 ^ _DAT_00121080,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_d8.v[0] + lVar4) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_d8.v[1] + lVar4 + 8) = 0x3ff0000000000000;
      }
      lVar6 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x80);
  }
  local_148 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = 0;
  lVar4 = 0;
  auVar13 = _DAT_00121070;
  do {
    if (SUB164(auVar13 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar13 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_148 + lVar4) = 0x3ff0000000000000;
      *(undefined8 *)(local_128 + lVar4) = 0x3ff0000000000000;
    }
    lVar6 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar6 + 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x80);
  padVar5 = (double (*) [3])&local_68;
  lVar4 = 0;
  do {
    lVar6 = 0;
    padVar7 = (double (*) [3])&local_d8;
    do {
      *(double *)(local_148 + lVar6 * 8 + lVar4 * 0x18) = 0.0;
      dVar10 = 0.0;
      lVar9 = 0;
      padVar8 = padVar7;
      do {
        dVar10 = dVar10 + (*(double (*) [3])*padVar5)[lVar9] * (*(double (*) [3])*padVar8)[0];
        lVar9 = lVar9 + 1;
        padVar8 = padVar8 + 1;
      } while (lVar9 != 3);
      *(double *)(local_148 + lVar6 * 8 + lVar4 * 0x18) = dVar10;
      lVar6 = lVar6 + 1;
      padVar7 = (double (*) [3])(*padVar7 + 1);
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    padVar5 = padVar5 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_68.v[0] + lVar4 + 0x10) = *(undefined8 *)(local_138 + lVar4);
    uVar1 = *(undefined8 *)(local_148 + lVar4 + 8);
    *(undefined8 *)((long)local_68.v[0] + lVar4) = *(undefined8 *)(local_148 + lVar4);
    *(undefined8 *)((long)local_68.v[0] + lVar4 + 8) = uVar1;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_138._8_8_;
  local_138 = auVar2 << 0x40;
  local_148 = (undefined1  [16])0x0;
  dVar10 = recoverAngleAxis(&local_68,(Vector3d *)local_148);
  __return_storage_ptr__->v[0] = local_88[0];
  __return_storage_ptr__->v[1] = local_88[1];
  __return_storage_ptr__->v[2] = local_88[2];
  __return_storage_ptr__->v[3] = 0.0;
  __return_storage_ptr__->v[4] = 0.0;
  __return_storage_ptr__->v[5] = 0.0;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    __return_storage_ptr__->v[3] = dVar10 * (double)local_148._0_8_;
    __return_storage_ptr__->v[4] = dVar10 * (double)local_148._8_8_;
    __return_storage_ptr__->v[5] = dVar10 * (double)local_138._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector6d combine(const Vector6d &pose0, const Vector6d &pose1)
{
  Matrix33d R=getRotation(pose0);
  Vector3d  T=R*getTranslation(pose1)+getTranslation(pose0);
  R=R*getRotation(pose1);
  return getPose(R, T);
}